

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool __thiscall ON_EnvironmentsImpl::operator==(ON_EnvironmentsImpl *this,ON_EnvironmentsImpl *ep)

{
  bool bVar1;
  bool bVar2;
  ON_UUID local_40;
  ON_UUID local_30;
  
  local_30 = BackgroundRenderEnvironmentId(this);
  local_40 = BackgroundRenderEnvironmentId(ep);
  bVar1 = ::operator!=(&local_30,&local_40);
  if (!bVar1) {
    bVar1 = SkylightingRenderEnvironmentOverride(this);
    bVar2 = SkylightingRenderEnvironmentOverride(ep);
    if (bVar1 == bVar2) {
      local_30 = SkylightingRenderEnvironmentId(this);
      local_40 = SkylightingRenderEnvironmentId(ep);
      bVar1 = ::operator!=(&local_30,&local_40);
      if (!bVar1) {
        bVar1 = ReflectionRenderEnvironmentOverride(this);
        bVar2 = ReflectionRenderEnvironmentOverride(ep);
        if (bVar1 == bVar2) {
          local_30 = ReflectionRenderEnvironmentId(this);
          local_40 = ReflectionRenderEnvironmentId(ep);
          bVar1 = ::operator!=(&local_30,&local_40);
          return !bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_EnvironmentsImpl::operator == (const ON_EnvironmentsImpl& ep)
{
  if (BackgroundRenderEnvironmentId()        != ep.BackgroundRenderEnvironmentId())        return false;
  if (SkylightingRenderEnvironmentOverride() != ep.SkylightingRenderEnvironmentOverride()) return false;
  if (SkylightingRenderEnvironmentId()       != ep.SkylightingRenderEnvironmentId())       return false;
  if (ReflectionRenderEnvironmentOverride()  != ep.ReflectionRenderEnvironmentOverride())  return false;
  if (ReflectionRenderEnvironmentId()        != ep.ReflectionRenderEnvironmentId())        return false;

  return true;
}